

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ccb0f7::ResizeRealtimeTest_TestInternalResizeDown_Test::TestBody
          (ResizeRealtimeTest_TestInternalResizeDown_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  reference pFVar3;
  char *message;
  ResizeRealtimeTest *in_RDI;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  FrameInfo *info;
  iterator __end1;
  iterator __begin1;
  vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
  *__range1;
  int resize_down_count;
  uint last_h;
  uint last_w;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffe6c;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffe74;
  uint *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  int iVar6;
  Message *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined2 in_stack_fffffffffffffe9c;
  undefined1 in_stack_fffffffffffffe9e;
  undefined1 in_stack_fffffffffffffe9f;
  uint in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb8;
  AssertionResult local_138 [2];
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 uVar7;
  AssertHelper *in_stack_fffffffffffffef0;
  __normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
  local_f0;
  vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
  *local_e8;
  int local_dc;
  uint local_d8;
  uint local_d4;
  uint local_bc;
  HasNewFatalFailureHelper local_b8;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [104];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"niklas_640_480_30.yuv",&local_89);
  uVar5 = 400;
  uVar4 = 0;
  libaom_test::I420VideoSource::I420VideoSource
            ((I420VideoSource *)in_RDI,
             (string *)
             CONCAT17(in_stack_fffffffffffffe9f,
                      CONCAT16(in_stack_fffffffffffffe9e,
                               CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))),
             (uint)((ulong)in_stack_fffffffffffffe90 >> 0x20),(uint)in_stack_fffffffffffffe90,
             (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),(int)in_stack_fffffffffffffe88,
             in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  (in_RDI->super_EncoderTest).cfg_.g_w = 0x280;
  (in_RDI->super_EncoderTest).cfg_.g_h = 0x1e0;
  in_RDI->change_bitrate_ = false;
  in_RDI->set_scale_mode_ = false;
  in_RDI->set_scale_mode2_ = false;
  in_RDI->set_scale_mode3_ = false;
  in_RDI->mismatch_psnr_ = 0.0;
  in_RDI->mismatch_nframes_ = 0;
  ResizeRealtimeTest::DefaultConfig(in_RDI);
  (in_RDI->super_EncoderTest).cfg_.rc_dropframe_thresh = 0;
  (in_RDI->super_EncoderTest).cfg_.rc_target_bitrate = 0x96;
  (in_RDI->super_EncoderTest).cfg_.rc_resize_mode = 3;
  (in_RDI->super_EncoderTest).cfg_.g_forced_max_frame_width = 0x500;
  (in_RDI->super_EncoderTest).cfg_.g_forced_max_frame_height = 0x500;
  uVar1 = testing::internal::AlwaysTrue();
  if ((bool)uVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)in_RDI);
    in_stack_fffffffffffffe9e = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffe9e) {
      (*(in_RDI->super_EncoderTest)._vptr_EncoderTest[2])(&in_RDI->super_EncoderTest,local_68);
    }
    bVar2 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(&local_b8);
    if (bVar2) {
      local_bc = 2;
    }
    else {
      local_bc = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT44(in_stack_fffffffffffffe74,uVar5));
    if (local_bc == 0) {
      local_d4 = (in_RDI->super_EncoderTest).cfg_.g_w;
      local_d8 = (in_RDI->super_EncoderTest).cfg_.g_h;
      local_dc = 0;
      local_e8 = &in_RDI->frame_info_list_;
      local_f0._M_current =
           (FrameInfo *)
           std::
           vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
           ::begin((vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                    *)CONCAT44(in_stack_fffffffffffffe6c,uVar4));
      std::
      vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>::
      end((vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
           *)CONCAT44(in_stack_fffffffffffffe6c,uVar4));
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffe74,uVar5),
                                (__normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffe6c,uVar4)), bVar2) {
        pFVar3 = __gnu_cxx::
                 __normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
                 ::operator*(&local_f0);
        if ((pFVar3->w != local_d4) || (pFVar3->h != local_d8)) {
          if ((pFVar3->w < local_d4) && (pFVar3->h < local_d8)) {
            local_dc = local_dc + 1;
          }
          local_d4 = pFVar3->w;
          local_d8 = pFVar3->h;
        }
        __gnu_cxx::
        __normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
        ::operator++(&local_f0);
      }
      uVar7 = 1;
      testing::internal::CmpHelperGE<int,int>
                (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                 (int *)in_stack_fffffffffffffe78,(int *)CONCAT44(in_stack_fffffffffffffe74,uVar5));
      bVar2 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffef0);
      if (!bVar2) {
        testing::Message::Message((Message *)in_RDI);
        in_stack_fffffffffffffe90 =
             testing::Message::operator<<
                       ((Message *)CONCAT44(in_stack_fffffffffffffe74,uVar5),
                        (char (*) [23])CONCAT44(in_stack_fffffffffffffe6c,uVar4));
        in_stack_fffffffffffffe88 =
             testing::AssertionResult::failure_message((AssertionResult *)0x8e22c9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_RDI,
                   CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe9c)),
                   (char *)in_stack_fffffffffffffe90,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20)
                   ,in_stack_fffffffffffffe80);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffef0,(Message *)CONCAT44(uVar7,in_stack_fffffffffffffee8));
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe74,uVar5));
        testing::Message::~Message((Message *)0x8e2317);
      }
      local_bc = (uint)!bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x8e2395);
      if (local_bc == 0) {
        ResizeRealtimeTest::GetMismatchFrames(in_RDI);
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                  (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                   (uint *)CONCAT44(in_stack_fffffffffffffe74,uVar5));
        iVar6 = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
        bVar2 = testing::AssertionResult::operator_cast_to_bool(local_138);
        if (!bVar2) {
          testing::Message::Message((Message *)in_RDI);
          message = testing::AssertionResult::failure_message((AssertionResult *)0x8e241d);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_RDI,
                     CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe9c)),
                     (char *)in_stack_fffffffffffffe90,iVar6,message);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffef0,(Message *)CONCAT44(uVar7,in_stack_fffffffffffffee8))
          ;
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe74,uVar5));
          testing::Message::~Message((Message *)0x8e246b);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x8e24cd);
        local_bc = 0;
      }
      goto LAB_008e24d8;
    }
    if (local_bc != 2) goto LAB_008e24d8;
  }
  iVar6 = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  testing::Message::Message((Message *)in_RDI);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_RDI,
             CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe9c)),
             (char *)in_stack_fffffffffffffe90,iVar6,in_stack_fffffffffffffe80);
  testing::internal::AssertHelper::operator=
            (in_stack_fffffffffffffef0,
             (Message *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe74,uVar5));
  testing::Message::~Message((Message *)0x8e20c7);
  local_bc = 1;
LAB_008e24d8:
  libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x8e24e5);
  return;
}

Assistant:

TEST_P(ResizeRealtimeTest, TestInternalResizeDown) {
  ::libaom_test::I420VideoSource video("niklas_640_480_30.yuv", 640, 480, 30, 1,
                                       0, 400);
  cfg_.g_w = 640;
  cfg_.g_h = 480;
  change_bitrate_ = false;
  set_scale_mode_ = false;
  set_scale_mode2_ = false;
  set_scale_mode3_ = false;
  mismatch_psnr_ = 0.0;
  mismatch_nframes_ = 0;
  DefaultConfig();
  // Disable dropped frames.
  cfg_.rc_dropframe_thresh = 0;
  // Starting bitrate low.
  cfg_.rc_target_bitrate = 150;
  cfg_.rc_resize_mode = RESIZE_DYNAMIC;
  cfg_.g_forced_max_frame_width = 1280;
  cfg_.g_forced_max_frame_height = 1280;
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));

#if CONFIG_AV1_DECODER
  unsigned int last_w = cfg_.g_w;
  unsigned int last_h = cfg_.g_h;
  int resize_down_count = 0;
  for (const auto &info : frame_info_list_) {
    if (info.w != last_w || info.h != last_h) {
      // Verify that resize down occurs.
      if (info.w < last_w && info.h < last_h) {
        resize_down_count++;
      }
      last_w = info.w;
      last_h = info.h;
    }
  }

  // Verify that we get at lease 1 resize down event in this test.
  ASSERT_GE(resize_down_count, 1) << "Resizing should occur.";
  EXPECT_EQ(static_cast<unsigned int>(0), GetMismatchFrames());
#else
  printf("Warning: AV1 decoder unavailable, unable to check resize count!\n");
#endif
}